

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O0

char * tnt_buf_resize(tnt_stream *s,size_t size)

{
  long *plVar1;
  long lVar2;
  size_t size_00;
  void *pvVar3;
  char *nd;
  size_t nsize;
  size_t off;
  tnt_stream_buf *sb;
  size_t size_local;
  tnt_stream *s_local;
  
  plVar1 = (long *)s->data;
  lVar2 = plVar1[1];
  size_00 = lVar2 + size;
  pvVar3 = tnt_mem_realloc((void *)*plVar1,size_00);
  if (pvVar3 == (void *)0x0) {
    tnt_mem_free((void *)*plVar1);
    s_local = (tnt_stream *)0x0;
  }
  else {
    *plVar1 = (long)pvVar3;
    plVar1[2] = size_00;
    s_local = (tnt_stream *)(*plVar1 + lVar2);
  }
  return (char *)s_local;
}

Assistant:

static char* tnt_buf_resize(struct tnt_stream *s, size_t size) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	size_t off = sb->size;
	size_t nsize = off + size;
	char *nd = tnt_mem_realloc(sb->data, nsize);
	if (nd == NULL) {
		tnt_mem_free(sb->data);
		return NULL;
	}
	sb->data = nd;
	sb->alloc = nsize;
	return sb->data + off;
}